

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *xx,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vec)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  int *piVar2;
  undefined8 *puVar3;
  uint *puVar4;
  char cVar5;
  int32_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  fpclass_type fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  type pcVar23;
  int *piVar24;
  cpp_dec_float<50U,_int,_void> *pcVar25;
  cpp_dec_float<50U,_int,_void> *pcVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  int *piVar28;
  long lVar29;
  long lVar30;
  Real RVar31;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_138;
  int local_100;
  int32_t local_fc;
  cpp_dec_float<50U,_int,_void> local_f8;
  long local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  long local_90;
  int32_t local_84;
  ulong local_80;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_78;
  undefined8 uStack_70;
  long local_60;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_78 = vec;
  if (this[0x38] ==
      (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
       )0x1) {
    local_90 = *(long *)(this + 0x20);
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    uStack_a0 = 0;
    local_b8._0_4_ = 0;
    local_b8._4_4_ = 0;
    uStack_b0._0_4_ = 0;
    uStack_b0._4_4_ = 0;
    local_98 = 0;
    lVar19 = (long)vec->memused;
    if (0 < lVar19) {
      lVar20 = lVar19 + 1;
      local_80 = 0;
      lVar19 = lVar19 * 0x3c;
      do {
        pSVar15 = local_78;
        pcVar27 = &local_138;
        lVar29 = lVar19 + -0x3c;
        lVar30 = (long)*(int *)((long)(&local_78->m_elem[-1].val + 1) + lVar19);
        lVar21 = lVar30 * 0x38;
        pcVar1 = (cpp_dec_float<50U,_int,_void> *)(local_90 + lVar21);
        local_60 = lVar20;
        if (*(int *)(local_90 + 0x30 + lVar21) == 2) {
LAB_0028f64a:
          pcVar26 = &local_f8;
          pcVar22 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)pSVar15->m_elem[-1].val.m_backend.data._M_elems + lVar19);
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          pcVar25 = pcVar22;
          if (pcVar22 == pcVar26) {
            pcVar25 = &xx->m_backend;
          }
          if (pcVar22 != pcVar26 && pcVar26 != &xx->m_backend) {
            uVar7 = *(undefined8 *)((xx->m_backend).data._M_elems + 8);
            local_f8.data._M_elems._32_5_ = SUB85(uVar7,0);
            local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_f8.data._M_elems._0_8_ = *(undefined8 *)(xx->m_backend).data._M_elems;
            local_f8.data._M_elems._8_8_ = *(undefined8 *)((xx->m_backend).data._M_elems + 2);
            local_f8.data._M_elems._16_8_ = *(undefined8 *)((xx->m_backend).data._M_elems + 4);
            uVar7 = *(undefined8 *)((xx->m_backend).data._M_elems + 6);
            local_f8.data._M_elems._24_5_ = SUB85(uVar7,0);
            local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_f8.exp = (xx->m_backend).exp;
            local_f8.neg = (xx->m_backend).neg;
            local_f8.fpclass = (xx->m_backend).fpclass;
            local_f8.prec_elem = (xx->m_backend).prec_elem;
            pcVar25 = pcVar22;
          }
          local_c0 = lVar29;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (pcVar26,pcVar25);
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 10;
          local_138.data._M_elems._0_16_ = ZEXT816(0);
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems._24_5_ = 0;
          local_138.data._M_elems[7]._1_3_ = 0;
          local_138.data._M_elems._32_5_ = 0;
          local_138.data._M_elems[9]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          if (pcVar27 != pcVar1) {
            uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_138.data._M_elems._32_5_ = SUB85(uVar7,0);
            local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_138.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_138.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_138.data._M_elems._24_5_ = SUB85(uVar7,0);
            local_138.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_138.exp = pcVar1->exp;
            local_138.neg = pcVar1->neg;
            local_138.fpclass = pcVar1->fpclass;
            local_138.prec_elem = pcVar1->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (pcVar27,pcVar26);
          uVar7 = local_138._48_8_;
          bVar10 = local_138.neg;
          iVar18 = local_138.exp;
          auVar9 = (undefined1  [16])local_138.data._M_elems._0_16_;
          uStack_a0 = CONCAT35(local_138.data._M_elems[7]._1_3_,local_138.data._M_elems._24_5_);
          local_b8._0_4_ = local_138.data._M_elems[0];
          local_b8._4_4_ = local_138.data._M_elems[1];
          uStack_b0._0_4_ = local_138.data._M_elems[2];
          uStack_b0._4_4_ = local_138.data._M_elems[3];
          local_a8._0_4_ = local_138.data._M_elems[4];
          local_a8._4_4_ = local_138.data._M_elems[5];
          local_98 = CONCAT35(local_138.data._M_elems[9]._1_3_,local_138.data._M_elems._32_5_);
          fVar11 = local_138.fpclass;
          iVar6 = local_138.prec_elem;
          local_138.data._M_elems._0_16_ = auVar9;
          RVar31 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
          uVar16 = local_138._48_8_;
          local_f8.data._M_elems._32_5_ = SUB85(local_98,0);
          local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_98 >> 0x28);
          local_f8.data._M_elems[4] = (uint)local_a8;
          local_f8.data._M_elems[5] = local_a8._4_4_;
          local_f8.data._M_elems._24_5_ = SUB85(uStack_a0,0);
          local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_a0 >> 0x28);
          local_f8.data._M_elems[0] = (uint)local_b8;
          local_f8.data._M_elems[1] = local_b8._4_4_;
          uVar17 = local_f8.data._M_elems._0_8_;
          local_f8.data._M_elems[2] = (uint)uStack_b0;
          local_f8.data._M_elems[3] = uStack_b0._4_4_;
          local_100 = iVar18;
          local_f8.exp = iVar18;
          local_f8.neg = bVar10;
          local_fc = iVar6;
          local_138.fpclass = (fpclass_type)uVar7;
          local_138.prec_elem = SUB84(uVar7,4);
          local_f8.fpclass = local_138.fpclass;
          local_f8.prec_elem = local_138.prec_elem;
          if ((bVar10 == true) &&
             (local_f8.data._M_elems[0] = (uint)local_b8,
             local_f8.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite)) {
            local_f8.neg = false;
          }
          local_138._48_8_ = uVar16;
          local_f8.data._M_elems._0_8_ = uVar17;
          if ((fVar11 != cpp_dec_float_NaN) && (!NAN(RVar31))) {
            local_138.fpclass = cpp_dec_float_finite;
            local_138.prec_elem = 10;
            local_138.data._M_elems[0] = 0;
            local_138.data._M_elems[1] = 0;
            local_138.data._M_elems[2] = 0;
            local_138.data._M_elems[3] = 0;
            local_138.data._M_elems[4] = 0;
            local_138.data._M_elems[5] = 0;
            local_138.data._M_elems._24_5_ = 0;
            local_138.data._M_elems[7]._1_3_ = 0;
            local_138.data._M_elems._32_5_ = 0;
            local_138.data._M_elems[9]._1_3_ = 0;
            local_138.exp = 0;
            local_138.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_138,RVar31);
            iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_f8,&local_138);
            if (0 < iVar18) {
              *(undefined8 *)((pcVar1->data)._M_elems + 8) = local_98;
              *(undefined8 *)((pcVar1->data)._M_elems + 4) = local_a8;
              *(undefined8 *)((pcVar1->data)._M_elems + 6) = uStack_a0;
              *(undefined8 *)(pcVar1->data)._M_elems = local_b8;
              *(undefined8 *)((pcVar1->data)._M_elems + 2) = uStack_b0;
              pcVar1->exp = local_100;
              pcVar1->neg = bVar10;
              pcVar1->fpclass = fVar11;
              pcVar1->prec_elem = local_fc;
              lVar29 = local_c0;
              uVar7 = local_f8.data._M_elems._8_8_;
              uVar16 = local_f8.data._M_elems._16_8_;
              uVar17 = local_f8._48_8_;
              goto LAB_0028f8dc;
            }
          }
          lVar29 = local_c0;
          pcVar23 = boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)pcVar1,1e-100);
          local_80 = CONCAT71((int7)((ulong)pcVar23 >> 8),1);
          uVar7 = local_f8.data._M_elems._8_8_;
          uVar16 = local_f8.data._M_elems._16_8_;
          uVar17 = local_f8._48_8_;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (pcVar27,0,(type *)0x0);
          iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar1,pcVar27);
          if (iVar18 != 0) goto LAB_0028f64a;
          pcVar25 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)pSVar15->m_elem[-1].val.m_backend.data._M_elems + lVar19);
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 10;
          local_138.data._M_elems._32_5_ = 0;
          local_138.data._M_elems[9]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems._24_5_ = 0;
          local_138.data._M_elems[7]._1_3_ = 0;
          local_138.data._M_elems._0_16_ = ZEXT816(0);
          pcVar26 = pcVar25;
          if (pcVar25 == pcVar27) {
            pcVar26 = &xx->m_backend;
          }
          if (pcVar25 != pcVar27 && pcVar27 != &xx->m_backend) {
            uVar7 = *(undefined8 *)((xx->m_backend).data._M_elems + 8);
            local_138.data._M_elems._32_5_ = SUB85(uVar7,0);
            local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_138.data._M_elems._0_16_ = *(undefined1 (*) [16])(xx->m_backend).data._M_elems;
            local_138.data._M_elems._16_8_ = *(undefined8 *)((xx->m_backend).data._M_elems + 4);
            uVar7 = *(undefined8 *)((xx->m_backend).data._M_elems + 6);
            local_138.data._M_elems._24_5_ = SUB85(uVar7,0);
            local_138.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_138.exp = (xx->m_backend).exp;
            local_138.neg = (xx->m_backend).neg;
            local_138.fpclass = (xx->m_backend).fpclass;
            local_138.prec_elem = (xx->m_backend).prec_elem;
            pcVar26 = pcVar25;
          }
          local_c0 = lVar30;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (pcVar27,pcVar26);
          uVar12 = local_138._48_8_;
          iVar18 = local_138.exp;
          auVar9 = (undefined1  [16])local_138.data._M_elems._0_16_;
          uStack_a0 = CONCAT35(local_138.data._M_elems[7]._1_3_,local_138.data._M_elems._24_5_);
          local_b8._0_4_ = local_138.data._M_elems[0];
          local_b8._4_4_ = local_138.data._M_elems[1];
          uStack_b0._0_4_ = local_138.data._M_elems[2];
          uStack_b0._4_4_ = local_138.data._M_elems[3];
          local_a8._0_4_ = local_138.data._M_elems[4];
          local_a8._4_4_ = local_138.data._M_elems[5];
          local_98 = CONCAT35(local_138.data._M_elems[9]._1_3_,local_138.data._M_elems._32_5_);
          local_fc = CONCAT31(local_fc._1_3_,local_138.neg);
          fVar11 = local_138.fpclass;
          iVar6 = local_138.prec_elem;
          local_138.data._M_elems._0_16_ = auVar9;
          RVar31 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
          lVar19 = local_c0;
          uVar13 = local_138._48_8_;
          local_f8.data._M_elems._32_5_ = SUB85(local_98,0);
          local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_98 >> 0x28);
          uVar17._0_4_ = (uint)local_b8;
          uVar17._4_4_ = local_b8._4_4_;
          uVar7._0_4_ = (uint)uStack_b0;
          uVar7._4_4_ = uStack_b0._4_4_;
          uVar16._0_4_ = (uint)local_a8;
          uVar16._4_4_ = local_a8._4_4_;
          local_f8.data._M_elems[4] = (uint)local_a8;
          local_f8.data._M_elems[5] = local_a8._4_4_;
          local_f8.data._M_elems._24_5_ = SUB85(uStack_a0,0);
          local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_a0 >> 0x28);
          local_f8.data._M_elems[0] = (uint)local_b8;
          local_f8.data._M_elems[1] = local_b8._4_4_;
          uVar14 = local_f8.data._M_elems._0_8_;
          local_f8.data._M_elems[2] = (uint)uStack_b0;
          local_f8.data._M_elems[3] = uStack_b0._4_4_;
          local_100 = iVar18;
          local_f8.exp = iVar18;
          bVar10 = local_fc._0_1_;
          local_f8.neg = local_fc._0_1_;
          local_84 = iVar6;
          local_138.fpclass = (fpclass_type)uVar12;
          local_138.prec_elem = SUB84(uVar12,4);
          uVar8._0_4_ = local_138.fpclass;
          uVar8._4_4_ = local_138.prec_elem;
          local_138.fpclass = (fpclass_type)uVar12;
          local_138.prec_elem = SUB84(uVar12,4);
          local_f8.fpclass = local_138.fpclass;
          local_f8.prec_elem = local_138.prec_elem;
          if ((local_fc._0_1_ == true) &&
             (local_f8.data._M_elems[0] = (uint)local_b8,
             local_f8.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite)) {
            local_f8.neg = false;
          }
          local_138._48_8_ = uVar13;
          local_f8.data._M_elems._0_8_ = uVar17;
          uVar17 = uVar8;
          if ((fVar11 != cpp_dec_float_NaN) &&
             (local_f8.data._M_elems._0_8_ = uVar14, uVar7 = local_f8.data._M_elems._8_8_,
             uVar16 = local_f8.data._M_elems._16_8_, uVar17 = local_f8._48_8_, !NAN(RVar31))) {
            local_138.fpclass = cpp_dec_float_finite;
            local_138.prec_elem = 10;
            local_138.data._M_elems[0] = 0;
            local_138.data._M_elems[1] = 0;
            local_138.data._M_elems[2] = 0;
            local_138.data._M_elems[3] = 0;
            local_138.data._M_elems[4] = 0;
            local_138.data._M_elems[5] = 0;
            local_138.data._M_elems._24_5_ = 0;
            local_138.data._M_elems[7]._1_3_ = 0;
            local_138.data._M_elems._32_5_ = 0;
            local_138.data._M_elems[9]._1_3_ = 0;
            local_138.exp = 0;
            local_138.neg = false;
            local_f8._48_8_ = uVar8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_138,RVar31);
            iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_f8,&local_138);
            uVar7 = local_f8.data._M_elems._8_8_;
            uVar16 = local_f8.data._M_elems._16_8_;
            uVar17 = local_f8._48_8_;
            if (0 < iVar18) {
              *(undefined8 *)((pcVar1->data)._M_elems + 8) = local_98;
              *(undefined8 *)((pcVar1->data)._M_elems + 4) = local_a8;
              *(undefined8 *)((pcVar1->data)._M_elems + 6) = uStack_a0;
              *(undefined8 *)(pcVar1->data)._M_elems = local_b8;
              *(undefined8 *)((pcVar1->data)._M_elems + 2) = uStack_b0;
              pcVar1->exp = local_100;
              pcVar1->neg = bVar10;
              pcVar1->fpclass = fVar11;
              pcVar1->prec_elem = local_84;
              iVar18 = *(int *)(this + 8);
              *(int *)(this + 8) = iVar18 + 1;
              *(int *)(*(long *)(this + 0x10) + (long)iVar18 * 4) = (int)lVar19;
            }
          }
        }
LAB_0028f8dc:
        local_f8._48_8_ = uVar17;
        local_f8.data._M_elems._16_8_ = uVar16;
        local_f8.data._M_elems._8_8_ = uVar7;
        lVar20 = local_60 + -1;
        lVar19 = lVar29;
      } while (1 < lVar20);
      if ((local_80 & 1) != 0) {
        piVar24 = *(int **)(this + 0x10);
        piVar28 = piVar24;
        if (0 < (long)*(int *)(this + 8)) {
          piVar2 = piVar24 + *(int *)(this + 8);
          do {
            lVar19 = (long)*piVar24 * 0x38;
            local_98 = *(undefined8 *)(local_90 + 0x20 + lVar19);
            local_b8 = *(undefined8 *)(local_90 + lVar19);
            uStack_b0 = ((undefined8 *)(local_90 + lVar19))[1];
            puVar3 = (undefined8 *)(local_90 + 0x10 + lVar19);
            local_a8 = *puVar3;
            uStack_a0 = puVar3[1];
            iVar18 = *(int *)(local_90 + 0x28 + lVar19);
            cVar5 = *(char *)(local_90 + 0x2c + lVar19);
            local_38 = *(undefined8 *)(local_90 + 0x20 + lVar19);
            local_58 = *(uint (*) [2])(local_90 + lVar19);
            auStack_50 = *(uint (*) [2])((uint *)(local_90 + lVar19) + 2);
            puVar4 = (uint *)(local_90 + 0x10 + lVar19);
            local_48 = *(uint (*) [2])puVar4;
            uStack_40 = *(undefined8 *)(puVar4 + 2);
            uVar7 = *(undefined8 *)(local_90 + 0x30 + lVar19);
            uStack_70 = 0;
            local_78 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)uVar7;
            RVar31 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
            local_f8.data._M_elems._32_5_ = SUB85(local_38,0);
            local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_38 >> 0x28);
            local_f8.data._M_elems[4] = local_48[0];
            local_f8.data._M_elems[5] = local_48[1];
            local_f8.data._M_elems._24_5_ = SUB85(uStack_40,0);
            local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_40 >> 0x28);
            local_f8.data._M_elems[0] = local_58[0];
            local_f8.data._M_elems[1] = local_58[1];
            uVar16 = local_f8.data._M_elems._0_8_;
            local_f8.data._M_elems[2] = auStack_50[0];
            local_f8.data._M_elems[3] = auStack_50[1];
            local_f8.neg = (bool)cVar5;
            if ((cVar5 == '\x01') &&
               (local_f8.data._M_elems[0] = local_58[0],
               local_f8.data._M_elems[0] != 0 || (fpclass_type)local_78 != cpp_dec_float_finite)) {
              local_f8.neg = false;
            }
            local_f8.data._M_elems._0_8_ = uVar16;
            local_f8.exp = iVar18;
            local_f8._48_8_ = uVar7;
            if (((fpclass_type)local_78 == cpp_dec_float_NaN) || (NAN(RVar31))) {
LAB_0028fd88:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)((long)*piVar24 * 0x38 + local_90),0);
            }
            else {
              local_138.fpclass = cpp_dec_float_finite;
              local_138.prec_elem = 10;
              local_138.data._M_elems[0] = 0;
              local_138.data._M_elems[1] = 0;
              local_138.data._M_elems[2] = 0;
              local_138.data._M_elems[3] = 0;
              local_138.data._M_elems[4] = 0;
              local_138.data._M_elems[5] = 0;
              local_138.data._M_elems._24_5_ = 0;
              local_138.data._M_elems[7]._1_3_ = 0;
              local_138.data._M_elems._32_5_ = 0;
              local_138.data._M_elems[9]._1_3_ = 0;
              local_138.exp = 0;
              local_138.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_138,RVar31);
              iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_f8,&local_138);
              if (iVar18 < 1) goto LAB_0028fd88;
              *piVar28 = *piVar24;
              piVar28 = piVar28 + 1;
            }
            piVar24 = piVar24 + 1;
          } while (piVar24 < piVar2);
        }
        *(int *)(this + 8) = (int)((ulong)((long)piVar28 - *(long *)(this + 0x10)) >> 2);
      }
    }
  }
  else {
    lVar19 = (long)vec->memused;
    if (0 < lVar19) {
      lVar20 = lVar19 + 1;
      pcVar1 = &local_138;
      lVar19 = lVar19 * 0x3c;
      do {
        pcVar26 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)vec->m_elem[-1].val.m_backend.data._M_elems + lVar19);
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 10;
        local_138.data._M_elems._32_5_ = 0;
        local_138.data._M_elems[9]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems._24_5_ = 0;
        local_138.data._M_elems[7]._1_3_ = 0;
        local_138.data._M_elems._0_16_ = ZEXT816(0);
        pcVar27 = pcVar26;
        if (pcVar26 == pcVar1) {
          pcVar27 = &xx->m_backend;
        }
        if (pcVar26 != pcVar1 && pcVar1 != &xx->m_backend) {
          uVar7 = *(undefined8 *)((xx->m_backend).data._M_elems + 8);
          local_138.data._M_elems._32_5_ = SUB85(uVar7,0);
          local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_138.data._M_elems._0_16_ = *(undefined1 (*) [16])(xx->m_backend).data._M_elems;
          local_138.data._M_elems._16_8_ = *(undefined8 *)((xx->m_backend).data._M_elems + 4);
          uVar7 = *(undefined8 *)((xx->m_backend).data._M_elems + 6);
          local_138.data._M_elems._24_5_ = SUB85(uVar7,0);
          local_138.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_138.exp = (xx->m_backend).exp;
          local_138.neg = (xx->m_backend).neg;
          local_138.fpclass = (xx->m_backend).fpclass;
          local_138.prec_elem = (xx->m_backend).prec_elem;
          pcVar27 = pcVar26;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar1,pcVar27);
        vec = local_78;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)*(int *)((long)(&local_78->m_elem[-1].val + 1) + lVar19) * 0x38 +
                   *(long *)(this + 0x20)),pcVar1);
        lVar20 = lVar20 + -1;
        lVar19 = lVar19 + -0x3c;
      } while (1 < lVar20);
    }
  }
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::multAdd(S xx, const SVectorBase<T>& vec)
{
   if(isSetup())
   {
      R* v = VectorBase<R>::val.data();
      R x;
      bool adjust = false;
      int j;

      for(int i = vec.size() - 1; i >= 0; --i)
      {
         j = vec.index(i);

         if(v[j] != 0)
         {
            x = v[j] + xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
               v[j] = x;
            else
            {
               adjust = true;
               v[j] = SOPLEX_VECTOR_MARKER;
            }
         }
         else
         {
            x = xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
            {
               v[j] = x;
               addIdx(j);
            }
         }
      }

      if(adjust)
      {
         int* iptr = idx;
         int* iiptr = idx;
         int* endptr = idx + num;

         for(; iptr < endptr; ++iptr)
         {
            x = v[*iptr];

            if(isNotZero(x, this->tolerances()->epsilon()))
               *iiptr++ = *iptr;
            else
               v[*iptr] = 0;
         }

         num = int(iiptr - idx);
      }
   }
   else
      VectorBase<R>::multAdd(xx, vec);

   assert(isConsistent());

   return *this;
}